

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

DP_RS_Stream
EvpathInitReader(CP_Services Svcs,void *CP_Stream,void **ReaderContactInfoPtr,_SstParams *Params,
                attr_list WriterContact,SstStats Stats)

{
  undefined4 uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  CManager p_Var4;
  SMPI_Comm comm;
  CManager p_Var5;
  undefined8 uVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char **ppcVar10;
  
  pvVar2 = calloc(1,0xa0);
  puVar3 = (undefined8 *)calloc(1,0x18);
  p_Var4 = (*Svcs->getCManager)(CP_Stream);
  comm = (*Svcs->getMPIComm)(CP_Stream);
  p_Var5 = (*Svcs->getCManager)(CP_Stream);
  uVar6 = create_attr_list();
  *(void **)((long)pvVar2 + 8) = CP_Stream;
  *(SstStats *)((long)pvVar2 + 0x90) = Stats;
  *(undefined8 *)((long)pvVar2 + 0x98) = 0xffffffffffffffff;
  pthread_mutex_init((pthread_mutex_t *)((long)pvVar2 + 0x18),(pthread_mutexattr_t *)0x0);
  SMPI_Comm_rank(comm,(int *)((long)pvVar2 + 0x40));
  pcVar7 = Params->WANDataTransport;
  uVar1 = attr_atom_from_string("CM_TRANSPORT");
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "sockets";
  }
  else {
    pcVar7 = Params->WANDataTransport;
  }
  pcVar7 = strdup(pcVar7);
  set_string_attr(uVar6,uVar1,pcVar7);
  if (Params->DataInterface == (char *)0x0) {
    if (Params->NetworkInterface == (char *)0x0) goto LAB_00729443;
    ppcVar10 = &Params->NetworkInterface;
  }
  else {
    ppcVar10 = &Params->DataInterface;
  }
  uVar1 = attr_atom_from_string("IP_INTERFACE");
  pcVar7 = strdup(*ppcVar10);
  set_string_attr(uVar6,uVar1,pcVar7);
LAB_00729443:
  CMlisten_specific(p_Var5,uVar6);
  uVar8 = CMget_specific_contact_list(p_Var5,uVar6);
  uVar9 = attr_list_to_string(uVar8);
  free_attr_list(uVar8);
  free_attr_list(uVar6);
  uVar6 = CMregister_format(p_Var4,EvpathReadRequestStructs);
  *(undefined8 *)((long)pvVar2 + 0x10) = uVar6;
  uVar6 = CMregister_format(p_Var4,EvpathReadReplyStructs);
  CMregister_handler(uVar6,EvpathReadReplyHandler,Svcs);
  uVar6 = CMregister_format(p_Var4,EvpathPreloadStructs);
  CMregister_handler(uVar6,EvpathPreloadHandler,Svcs);
  *puVar3 = uVar9;
  puVar3[2] = pvVar2;
  *(undefined8 **)((long)pvVar2 + 0x68) = puVar3;
  *ReaderContactInfoPtr = puVar3;
  return pvVar2;
}

Assistant:

static DP_RS_Stream EvpathInitReader(CP_Services Svcs, void *CP_Stream, void **ReaderContactInfoPtr,
                                     struct _SstParams *Params, attr_list WriterContact,
                                     SstStats Stats)
{
    Evpath_RS_Stream Stream = malloc(sizeof(struct _Evpath_RS_Stream));
    EvpathReaderContactInfo Contact = malloc(sizeof(struct _EvpathReaderContactInfo));
    CManager cm = Svcs->getCManager(CP_Stream);
    char *EvpathContactString;
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;
    CManager CM = Svcs->getCManager(CP_Stream);
    attr_list ListenAttrs = create_attr_list();

    memset(Stream, 0, sizeof(*Stream));
    memset(Contact, 0, sizeof(*Contact));

    /*
     * save the CP_stream value of later use
     */
    Stream->CP_Stream = CP_Stream;
    Stream->Stats = Stats;
    Stream->LastPreloadTimestep = -1;

    pthread_mutex_init(&Stream->DataLock, NULL);

    SMPI_Comm_rank(comm, &Stream->Rank);

    if (Params->WANDataTransport)
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("CM_TRANSPORT"),
                        strdup(Params->WANDataTransport));
    }
    else
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("CM_TRANSPORT"), strdup("sockets"));
    }

    if (Params->DataInterface)
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("IP_INTERFACE"),
                        strdup(Params->DataInterface));
    }
    else if (Params->NetworkInterface)
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("IP_INTERFACE"),
                        strdup(Params->NetworkInterface));
    }
    CMlisten_specific(CM, ListenAttrs);
    attr_list ContactList = CMget_specific_contact_list(CM, ListenAttrs);

    EvpathContactString = attr_list_to_string(ContactList);

    free_attr_list(ContactList);
    free_attr_list(ListenAttrs);

    /*
     * add a handler for read reply messages
     */
    Stream->ReadRequestFormat = CMregister_format(cm, EvpathReadRequestStructs);
    F = CMregister_format(cm, EvpathReadReplyStructs);
    CMregister_handler(F, EvpathReadReplyHandler, Svcs);

    /*
     * add a handler for timestep preload messages
     */
    F = CMregister_format(cm, EvpathPreloadStructs);
    CMregister_handler(F, EvpathPreloadHandler, Svcs);

    Contact->ContactString = EvpathContactString;
    Contact->RS_Stream = Stream;
    Stream->MyContactInfo = Contact;

    *ReaderContactInfoPtr = Contact;

    return Stream;
}